

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qatomic_cxx11.h
# Opt level: O0

void QAtomicOps<int>::storeRelease<int>(atomic<int> *_q_value,int newValue)

{
  memory_order mVar1;
  int in_ESI;
  int *in_RDI;
  memory_order __b;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int __line;
  int *__file;
  
  __line = in_ESI;
  __file = in_RDI;
  mVar1 = std::operator&(memory_order_release,__memory_order_mask);
  if (mVar1 == memory_order_acquire) {
    std::__replacement_assert
              ((char *)__file,__line,(char *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (mVar1 == memory_order_acq_rel) {
    std::__replacement_assert
              ((char *)__file,__line,(char *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (mVar1 == memory_order_consume) {
    std::__replacement_assert
              ((char *)__file,__line,(char *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  *in_RDI = in_ESI;
  return;
}

Assistant:

static inline
    void storeRelease(std::atomic<T> &_q_value, T newValue) noexcept
    {
        _q_value.store(newValue, std::memory_order_release);
    }